

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmSetPropertyCommand::InitialPass
          (cmSetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  bool bVar2;
  undefined1 uVar3;
  ostream *poVar4;
  uint uVar5;
  uint uVar6;
  pointer __lhs_00;
  ulong uVar7;
  string local_1e0;
  string *local_1c0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b8;
  string *local_1b0;
  ostringstream e;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"called with incorrect number of arguments",
               (allocator<char> *)&local_1e0);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  else {
    bVar2 = std::operator==(__lhs,"GLOBAL");
    uVar5 = 3;
    if ((!bVar2) && (bVar2 = std::operator==(__lhs,"DIRECTORY"), uVar5 = 2, !bVar2)) {
      bVar2 = std::operator==(__lhs,"TARGET");
      uVar5 = 0;
      if (!bVar2) {
        bVar2 = std::operator==(__lhs,"SOURCE");
        uVar5 = 1;
        if (!bVar2) {
          bVar2 = std::operator==(__lhs,"TEST");
          if (bVar2) {
            uVar5 = 5;
          }
          else {
            bVar2 = std::operator==(__lhs,"CACHE");
            if (bVar2) {
              uVar5 = 4;
            }
            else {
              bVar2 = std::operator==(__lhs,"INSTALL");
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                poVar4 = std::operator<<((ostream *)&e,"given invalid scope ");
                poVar4 = std::operator<<(poVar4,(string *)__lhs);
                poVar4 = std::operator<<(poVar4,".  ");
                std::operator<<(poVar4,
                                "Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, CACHE, INSTALL."
                               );
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_1e0);
                std::__cxx11::string::~string((string *)&local_1e0);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                return false;
              }
              uVar5 = 8;
            }
          }
        }
      }
    }
    __lhs_00 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_1c0 = &this->PropertyValue;
    local_1b0 = &this->PropertyName;
    local_1b8 = &this->Names;
    uVar7 = 1;
    while (__lhs_00 = __lhs_00 + 1, __lhs_00 != pbVar1) {
      bVar2 = std::operator==(__lhs_00,"PROPERTY");
      uVar6 = 2;
      if (!bVar2) {
        bVar2 = std::operator==(__lhs_00,"APPEND");
        if (bVar2) {
          this->Remove = false;
          this->AppendMode = true;
          this->AppendAsString = false;
        }
        else {
          bVar2 = std::operator==(__lhs_00,"APPEND_STRING");
          if (!bVar2) {
            uVar3 = (*(code *)(&DAT_00426e98 + *(int *)(&DAT_00426e98 + uVar7 * 4)))();
            return (bool)uVar3;
          }
          this->Remove = false;
          this->AppendMode = true;
          this->AppendAsString = true;
        }
        uVar6 = 0;
      }
      uVar7 = (ulong)uVar6;
    }
    if ((this->PropertyName)._M_string_length != 0) {
      switch(uVar5) {
      case 0:
        bVar2 = HandleTargetMode(this);
        return bVar2;
      case 1:
        bVar2 = HandleSourceMode(this);
        return bVar2;
      case 2:
        bVar2 = HandleDirectoryMode(this);
        return bVar2;
      case 3:
        bVar2 = HandleGlobalMode(this);
        return bVar2;
      case 4:
        bVar2 = HandleCacheMode(this);
        return bVar2;
      case 5:
        bVar2 = HandleTestMode(this);
        return bVar2;
      default:
        return true;
      case 8:
        bVar2 = HandleInstallMode(this);
        return bVar2;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"not given a PROPERTY <name> argument.",(allocator<char> *)&local_1e0);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  std::__cxx11::string::~string((string *)&e);
  return false;
}

Assistant:

bool cmSetPropertyCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // Get the scope on which to set the property.
  std::string const& scopeName = args.front();
  cmProperty::ScopeType scope;
  if (scopeName == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (scopeName == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (scopeName == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (scopeName == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (scopeName == "TEST") {
    scope = cmProperty::TEST;
  } else if (scopeName == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (scopeName == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    std::ostringstream e;
    e << "given invalid scope " << scopeName << ".  "
      << "Valid scopes are GLOBAL, DIRECTORY, "
         "TARGET, SOURCE, TEST, CACHE, INSTALL.";
    this->SetError(e.str());
    return false;
  }

  // Parse the rest of the arguments up to the values.
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingProperty,
    DoingValues
  };
  Doing doing = DoingNames;
  const char* sep = "";
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "PROPERTY") {
      doing = DoingProperty;
    } else if (arg == "APPEND") {
      doing = DoingNone;
      this->AppendMode = true;
      this->Remove = false;
      this->AppendAsString = false;
    } else if (arg == "APPEND_STRING") {
      doing = DoingNone;
      this->AppendMode = true;
      this->Remove = false;
      this->AppendAsString = true;
    } else if (doing == DoingNames) {
      this->Names.insert(arg);
    } else if (doing == DoingProperty) {
      this->PropertyName = arg;
      doing = DoingValues;
    } else if (doing == DoingValues) {
      this->PropertyValue += sep;
      sep = ";";
      this->PropertyValue += arg;
      this->Remove = false;
    } else {
      std::ostringstream e;
      e << "given invalid argument \"" << arg << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  // Make sure a property name was found.
  if (this->PropertyName.empty()) {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  // Dispatch property setting.
  switch (scope) {
    case cmProperty::GLOBAL:
      return this->HandleGlobalMode();
    case cmProperty::DIRECTORY:
      return this->HandleDirectoryMode();
    case cmProperty::TARGET:
      return this->HandleTargetMode();
    case cmProperty::SOURCE_FILE:
      return this->HandleSourceMode();
    case cmProperty::TEST:
      return this->HandleTestMode();
    case cmProperty::CACHE:
      return this->HandleCacheMode();
    case cmProperty::INSTALL:
      return this->HandleInstallMode();

    case cmProperty::VARIABLE:
    case cmProperty::CACHED_VARIABLE:
      break; // should never happen
  }
  return true;
}